

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_write_u64(mpack_writer_t *writer,uint64_t value)

{
  _Bool _Var1;
  uint8_t *u;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  uint8_t *u_1;
  uint uVar5;
  
  if (value < 0x80) {
    pcVar2 = writer->current;
    if (writer->end == pcVar2) {
      _Var1 = mpack_writer_ensure(writer,1);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    *pcVar2 = (char)value;
    lVar4 = 1;
  }
  else if (value < 0x100) {
    pcVar2 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar2) < 2) {
      _Var1 = mpack_writer_ensure(writer,2);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    lVar4 = 2;
    *pcVar2 = -0x34;
    pcVar2[1] = (char)value;
  }
  else if (value < 0x10000) {
    pcVar2 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar2) < 3) {
      _Var1 = mpack_writer_ensure(writer,3);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    lVar4 = 3;
    *pcVar2 = -0x33;
    *(ushort *)(pcVar2 + 1) = (ushort)value << 8 | (ushort)value >> 8;
  }
  else {
    pcVar2 = writer->current;
    uVar3 = (long)writer->end - (long)pcVar2;
    if (value >> 0x20 == 0) {
      if (uVar3 < 5) {
        _Var1 = mpack_writer_ensure(writer,5);
        if (!_Var1) {
          return;
        }
        pcVar2 = writer->current;
      }
      lVar4 = 5;
      *pcVar2 = -0x32;
      uVar5 = (uint)value;
      *(uint *)(pcVar2 + 1) =
           uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
    else {
      if (uVar3 < 9) {
        _Var1 = mpack_writer_ensure(writer,9);
        if (!_Var1) {
          return;
        }
        pcVar2 = writer->current;
      }
      lVar4 = 9;
      *pcVar2 = -0x31;
      *(uint64_t *)(pcVar2 + 1) =
           value >> 0x38 | (value & 0xff000000000000) >> 0x28 | (value & 0xff0000000000) >> 0x18 |
           (value & 0xff00000000) >> 8 | (value & 0xff000000) << 8 | (value & 0xff0000) << 0x18 |
           (value & 0xff00) << 0x28 | value << 0x38;
    }
  }
  writer->current = writer->current + lVar4;
  return;
}

Assistant:

void mpack_write_u64(mpack_writer_t* writer, uint64_t value) {
    mpack_writer_track_element(writer);

    if (value <= 127) {
        MPACK_WRITE_ENCODED(mpack_encode_fixuint, MPACK_TAG_SIZE_FIXUINT, (uint8_t)value);
    } else if (value <= UINT8_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u8, MPACK_TAG_SIZE_U8, (uint8_t)value);
    } else if (value <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u16, MPACK_TAG_SIZE_U16, (uint16_t)value);
    } else if (value <= UINT32_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_u32, MPACK_TAG_SIZE_U32, (uint32_t)value);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_u64, MPACK_TAG_SIZE_U64, value);
    }
}